

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O1

void gdImageCopyMergeGray
               (gdImagePtr dst,gdImagePtr src,int dstX,int dstY,int srcX,int srcY,int w,int h,
               int pct)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int b;
  uint uVar8;
  int r;
  int g;
  int x;
  int x_00;
  int local_74;
  
  if (0 < h) {
    fVar2 = (float)pct / 100.0;
    local_74 = srcY;
    do {
      x = dstX;
      x_00 = srcX;
      if (0 < w) {
        do {
          uVar3 = gdImageGetPixel(src,x_00,local_74);
          if (src->transparent != uVar3) {
            if (pct + -100 != 0 || dst != src) {
              uVar4 = gdImageGetPixel(dst,x,dstY);
              if (dst->trueColor == 0) {
                uVar7 = dst->red[(int)uVar4];
                uVar8 = dst->green[(int)uVar4];
              }
              else {
                uVar7 = uVar4 >> 0x10 & 0xff;
                uVar8 = uVar4 >> 8 & 0xff;
              }
              if (dst->trueColor == 0) {
                uVar4 = dst->blue[(int)uVar4];
              }
              else {
                uVar4 = uVar4 & 0xff;
              }
              if (src->trueColor == 0) {
                uVar5 = src->red[(int)uVar3];
                uVar6 = src->green[(int)uVar3];
                uVar3 = src->blue[(int)uVar3];
              }
              else {
                uVar5 = uVar3 >> 0x10 & 0xff;
                uVar6 = uVar3 >> 8 & 0xff;
                uVar3 = uVar3 & 0xff;
              }
              fVar1 = ((float)(int)uVar4 * 0.114 +
                      (float)(int)uVar7 * 0.299 + (float)(int)uVar8 * 0.587) *
                      ((float)-(pct + -100) / 100.0);
              r = (int)((float)(int)uVar5 * fVar2 + fVar1);
              g = (int)((float)(int)uVar6 * fVar2 + fVar1);
              b = (int)((float)(int)uVar3 * fVar2 + fVar1);
              uVar3 = gdImageColorExactAlpha(dst,r,g,b,0);
              if ((uVar3 == 0xffffffff) &&
                 (uVar3 = gdImageColorAllocateAlpha(dst,r,g,b,0), uVar3 == 0xffffffff)) {
                uVar3 = gdImageColorClosestAlpha(dst,r,g,b,0);
              }
            }
            gdImageSetPixel(dst,x,dstY,uVar3);
          }
          x_00 = x_00 + 1;
          x = x + 1;
        } while (x_00 < w + srcX);
      }
      dstY = dstY + 1;
      local_74 = local_74 + 1;
    } while (local_74 < h + srcY);
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageCopyMergeGray (gdImagePtr dst, gdImagePtr src, int dstX, int dstY,
										int srcX, int srcY, int w, int h, int pct)
{

	int c, dc;
	int x, y;
	int tox, toy;
	int ncR, ncG, ncB;
	float g;
	toy = dstY;
	for (y = srcY; (y < (srcY + h)); y++) {
		tox = dstX;
		for (x = srcX; (x < (srcX + w)); x++) {
			int nc;
			c = gdImageGetPixel (src, x, y);
			/* Added 7/24/95: support transparent copies */
			if (gdImageGetTransparent (src) == c) {
				tox++;
				continue;
			}
			/*
			 * If it's the same image, mapping is NOT trivial since we
			 * merge with greyscale target, but if pct is 100, the grey
			 * value is not used, so it becomes trivial. pjw 2.0.12.
			 */
			if (dst == src && pct == 100) {
				nc = c;
			} else {
				dc = gdImageGetPixel (dst, tox, toy);
				g = 0.29900 * gdImageRed(dst, dc)
				    + 0.58700 * gdImageGreen(dst, dc) + 0.11400 * gdImageBlue(dst, dc);

				ncR = gdImageRed (src, c) * (pct / 100.0)
				      + g * ((100 - pct) / 100.0);
				ncG = gdImageGreen (src, c) * (pct / 100.0)
				      + g * ((100 - pct) / 100.0);
				ncB = gdImageBlue (src, c) * (pct / 100.0)
				      + g * ((100 - pct) / 100.0);

				/* First look for an exact match */
				nc = gdImageColorExact (dst, ncR, ncG, ncB);
				if (nc == (-1)) {
					/* No, so try to allocate it */
					nc = gdImageColorAllocate (dst, ncR, ncG, ncB);
					/* If we're out of colors, go for the
					   closest color */
					if (nc == (-1)) {
						nc = gdImageColorClosest (dst, ncR, ncG, ncB);
					}
				}
			}
			gdImageSetPixel (dst, tox, toy, nc);
			tox++;
		}
		toy++;
	}
}